

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

VP8LHistogramSet * VP8LAllocateHistogramSet(int size,int cache_bits)

{
  size_t nmemb;
  int in_EDI;
  uint8_t *memory;
  size_t total_size;
  VP8LHistogramSet *set;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd0;
  VP8LHistogram *h;
  int local_14;
  VP8LHistogramSet *local_8;
  
  nmemb = HistogramSetTotalSize
                    ((int)(in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0);
  local_8 = (VP8LHistogramSet *)WebPSafeMalloc(nmemb,in_stack_ffffffffffffffd0);
  if (local_8 == (VP8LHistogramSet *)0x0) {
    local_8 = (VP8LHistogramSet *)0x0;
  }
  else {
    h = (VP8LHistogram *)(local_8 + 1);
    local_8->histograms = (VP8LHistogram **)h;
    local_8->max_size = in_EDI;
    local_8->size = in_EDI;
    HistogramSetResetPointers(local_8,(int)(nmemb >> 0x20));
    for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
      VP8LHistogramInit(h,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
  }
  return local_8;
}

Assistant:

VP8LHistogramSet* VP8LAllocateHistogramSet(int size, int cache_bits) {
  int i;
  VP8LHistogramSet* set;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;

  set = (VP8LHistogramSet*)memory;
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    VP8LHistogramInit(set->histograms[i], cache_bits, /*init_arrays=*/ 0);
  }
  return set;
}